

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pattern_formatter.h
# Opt level: O2

void __thiscall
spdlog::details::T_formatter::format
          (T_formatter *this,log_msg *param_1,tm *tm_time,memory_buffer *dest)

{
  char local_39;
  scoped_pad p;
  
  scoped_pad::scoped_pad(&p,8,&(this->super_flag_formatter).padinfo_,dest);
  fmt_helper::pad2<500ul>(tm_time->tm_hour,dest);
  local_39 = ':';
  fmt::v5::internal::basic_buffer<char>::push_back(&dest->super_basic_buffer<char>,&local_39);
  fmt_helper::pad2<500ul>(tm_time->tm_min,dest);
  local_39 = ':';
  fmt::v5::internal::basic_buffer<char>::push_back(&dest->super_basic_buffer<char>,&local_39);
  fmt_helper::pad2<500ul>(tm_time->tm_sec,dest);
  scoped_pad::~scoped_pad(&p);
  return;
}

Assistant:

void format(const details::log_msg &, const std::tm &tm_time, fmt::memory_buffer &dest) override
    {
        const size_t field_size = 8;
        scoped_pad p(field_size, padinfo_, dest);

        fmt_helper::pad2(tm_time.tm_hour, dest);
        dest.push_back(':');
        fmt_helper::pad2(tm_time.tm_min, dest);
        dest.push_back(':');
        fmt_helper::pad2(tm_time.tm_sec, dest);
    }